

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O2

XmlAttributePtr __thiscall libcellml::XmlNode::firstAttribute(XmlNode *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  XmlAttributePtr XVar1;
  xmlAttrPtr attribute;
  xmlAttrPtr local_28;
  __shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = *(xmlAttrPtr *)(*(long *)*in_RSI + 0x58);
  this->mPimpl = (XmlNodeImpl *)0x0;
  this[1].mPimpl = (XmlNodeImpl *)0x0;
  if (local_28 != (xmlAttrPtr)0x0) {
    std::make_shared<libcellml::XmlAttribute>();
    std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    XmlAttribute::setXmlAttribute((XmlAttribute *)this->mPimpl,&local_28);
    in_RDX._M_pi = extraout_RDX;
  }
  XVar1.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar1.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlAttributePtr)
         XVar1.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlAttributePtr XmlNode::firstAttribute() const
{
    xmlAttrPtr attribute = mPimpl->mXmlNodePtr->properties;
    XmlAttributePtr attributeHandle = nullptr;
    if (attribute != nullptr) {
        attributeHandle = std::make_shared<XmlAttribute>();
        attributeHandle->setXmlAttribute(attribute);
    }
    return attributeHandle;
}